

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

int match_capture_common(compiler_common *common,int stacksize,int offset,int private_data_ptr)

{
  sljit_compiler *compiler_00;
  sljit_compiler *compiler;
  int private_data_ptr_local;
  int offset_local;
  int stacksize_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  private_data_ptr_local = stacksize;
  if (common->capture_last_ptr != 0) {
    sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->capture_last_ptr);
    sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->capture_last_ptr,0x40,(long)(offset >> 1));
    sljit_emit_op1(compiler_00,0x20,0x8c,(long)(stacksize << 3),1,0);
    private_data_ptr_local = stacksize + 1;
  }
  if (common->optimized_cbracket[offset >> 1] == '\0') {
    sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->ovector_start + (long)offset * 8);
    sljit_emit_op1(compiler_00,0x20,4,0,0x8e,(long)common->ovector_start + (long)(offset + 1) * 8);
    sljit_emit_op1(compiler_00,0x20,0x8c,(long)(private_data_ptr_local << 3),1,0);
    sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)private_data_ptr);
    sljit_emit_op1(compiler_00,0x20,0x8c,(long)((private_data_ptr_local + 1) * 8),4,0);
    sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->ovector_start + (long)(offset + 1) * 8,2,0);
    sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->ovector_start + (long)offset * 8,1,0);
    private_data_ptr_local = private_data_ptr_local + 2;
  }
  return private_data_ptr_local;
}

Assistant:

static SLJIT_INLINE int match_capture_common(compiler_common *common, int stacksize, int offset, int private_data_ptr)
{
DEFINE_COMPILER;

if (common->capture_last_ptr != 0)
  {
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->capture_last_ptr);
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->capture_last_ptr, SLJIT_IMM, offset >> 1);
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(stacksize), TMP1, 0);
  stacksize++;
  }
if (common->optimized_cbracket[offset >> 1] == 0)
  {
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
  OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(stacksize), TMP1, 0);
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), private_data_ptr);
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(stacksize + 1), TMP2, 0);
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1), STR_PTR, 0);
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset), TMP1, 0);
  stacksize += 2;
  }
return stacksize;
}